

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

size_t fdb_estimate_space_used_from(fdb_file_handle *fhandle,fdb_snapshot_marker_t marker)

{
  filemgr_header_len_t fVar1;
  fdb_kvs_handle *handle_00;
  uint64_t uVar2;
  ulong in_RSI;
  undefined8 *in_RDI;
  docio_object doc;
  int64_t doc_offset;
  fdb_status status;
  file_status_t fstatus;
  fdb_seqnum_t seqnum;
  char *compacted_filename;
  uint64_t version;
  uint64_t header_flags;
  uint64_t kv_info_offset;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t datasize;
  uint64_t nlivenodes;
  uint64_t ndeletes;
  uint64_t ndocs;
  bid_t stale_root_bid;
  bid_t seq_root_bid;
  bid_t trie_root_bid;
  uint8_t header_buf [4096];
  size_t header_len;
  bid_t prev_bid;
  bid_t hdr_bid;
  filemgr *file;
  fdb_kvs_handle *handle;
  size_t ret;
  uint64_t deltasize;
  undefined1 *puVar3;
  docio_object *this;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffee98;
  undefined8 uVar4;
  err_log_callback *peVar5;
  undefined1 local_1138 [8];
  uint64_t *in_stack_ffffffffffffeed0;
  uint64_t *in_stack_ffffffffffffeed8;
  undefined4 in_stack_ffffffffffffeee0;
  kvs_stat_attr_t in_stack_ffffffffffffeee4;
  uint64_t *in_stack_ffffffffffffeee8;
  uint64_t *in_stack_ffffffffffffeef0;
  uint64_t *in_stack_ffffffffffffeef8;
  char **in_stack_ffffffffffffef00;
  fdb_status in_stack_ffffffffffffef08;
  uint in_stack_ffffffffffffef0c;
  size_t *in_stack_ffffffffffffef10;
  void *in_stack_ffffffffffffef18;
  uint64_t in_stack_ffffffffffffef20;
  filemgr *in_stack_ffffffffffffef28;
  bid_t local_10d0;
  fdb_kvs_handle *in_stack_ffffffffffffef38;
  __atomic_base<unsigned_long> local_10c0;
  long local_10b8;
  filemgr_header_revnum_t *in_stack_ffffffffffffef50;
  fdb_seqnum_t *in_stack_ffffffffffffef58;
  size_t *len;
  anon_union_8_2_18a01fae_for_docio_object_3 log_callback;
  void *bid;
  filemgr *in_stack_ffffffffffffef78;
  undefined1 in_stack_ffffffffffffef97;
  docio_object *in_stack_ffffffffffffef98;
  uint64_t *in_stack_ffffffffffffefa0;
  docio_handle *in_stack_ffffffffffffefa8;
  uint64_t *in_stack_ffffffffffffefb0;
  err_log_callback *in_stack_ffffffffffffefb8;
  ulong local_70;
  size_t local_58;
  long local_50;
  size_t local_38;
  
  local_58 = 0;
  local_70 = 0xffffffffffffffff;
  bid = (void *)0xffffffffffffffff;
  log_callback.seqnum = 0xffffffffffffffff;
  len = (size_t *)0xffffffffffffffff;
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) {
    local_38 = 0;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*in_RDI;
    if (handle_00->file == (filemgr *)0x0) {
      fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_FILE_NOT_OPEN,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                   ,"fdb_estimate_space_used_from",0x2113,"File not open.");
      local_38 = 0;
    }
    else {
      fdb_check_file_reopen(handle_00,&stack0xffffffffffffef0f);
      fdb_sync_db_header(in_stack_ffffffffffffef38);
      fVar1 = (handle_00->file->header).size;
      while (in_RSI <= local_70) {
        if (local_70 == 0xffffffffffffffff) {
          local_70 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffee98);
          peVar5 = &handle_00->log_callback;
          puVar3 = &stack0xffffffffffffef20;
          uVar4 = 0;
          in_stack_ffffffffffffef08 =
               filemgr_fetch_header
                         (in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
                          in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                          (fdb_seqnum_t *)
                          CONCAT44(in_stack_ffffffffffffef0c,in_stack_ffffffffffffef08),
                          (filemgr_header_revnum_t *)in_stack_ffffffffffffef00,
                          in_stack_ffffffffffffef50,in_stack_ffffffffffffef58,len,
                          (err_log_callback *)log_callback);
        }
        else {
          peVar5 = &handle_00->log_callback;
          puVar3 = &stack0xffffffffffffef20;
          uVar4 = 0;
          local_70 = filemgr_fetch_prev_header
                               (in_stack_ffffffffffffef78,(uint64_t)bid,(void *)log_callback,len,
                                in_stack_ffffffffffffef58,in_stack_ffffffffffffef50,
                                in_stack_ffffffffffffefa0,(uint64_t *)in_stack_ffffffffffffefa8,
                                in_stack_ffffffffffffefb0,in_stack_ffffffffffffefb8);
        }
        if (in_stack_ffffffffffffef08 != FDB_RESULT_SUCCESS) {
          fdb_log_impl(&handle_00->log_callback,2,(fdb_status)(ulong)(uint)in_stack_ffffffffffffef08
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                       ,"fdb_estimate_space_used_from",0x212f,"Failure to fetch DB header.",puVar3,
                       uVar4,peVar5);
          return 0;
        }
        if (fVar1 == 0) {
          fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_KV_STORE_NOT_FOUND,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                       ,"fdb_estimate_space_used_from",0x2135,"Failure to find DB header.",puVar3,
                       uVar4,peVar5);
          return 0;
        }
        puVar3 = &stack0xffffffffffffef50;
        this = (docio_object *)&local_10b8;
        in_stack_ffffffffffffee98 = &local_10c0;
        fdb_fetch_header(0,&stack0xffffffffffffef18,(bid_t *)&stack0xffffffffffffef28,&local_10d0,
                         (bid_t *)&stack0xffffffffffffef38,&in_stack_ffffffffffffee98->_M_i,
                         in_stack_ffffffffffffeed0,in_stack_ffffffffffffeed8,
                         (uint64_t *)CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
                         in_stack_ffffffffffffeee8,in_stack_ffffffffffffeef0,
                         in_stack_ffffffffffffeef8,in_stack_ffffffffffffef00,
                         (char **)((ulong)in_stack_ffffffffffffef0c << 0x20));
        if (in_RSI == local_70) {
          local_58 = local_10b8 * (ulong)(handle_00->config).blocksize + local_10c0._M_i + local_58;
          break;
        }
        local_58 = local_50 + local_58;
        if (local_10d0 != 0xffffffffffffffff) {
          docio_object::docio_object(this);
          memset(local_1138,0,0x38);
          in_stack_ffffffffffffef00 =
               (char **)docio_read_doc(in_stack_ffffffffffffefa8,(uint64_t)in_stack_ffffffffffffefa0
                                       ,in_stack_ffffffffffffef98,(bool)in_stack_ffffffffffffef97);
          if ((long)in_stack_ffffffffffffef00 < 1) {
            fdb_log_impl(&handle_00->log_callback,2,
                         (fdb_status)((ulong)in_stack_ffffffffffffef00 & 0xffffffff),
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                         ,"fdb_estimate_space_used_from",0x214c,"Read failure estimate_space_used.")
            ;
            return 0;
          }
          uVar2 = _kvs_stat_get_sum_attr
                            (in_stack_ffffffffffffeef0,(uint64_t)in_stack_ffffffffffffeee8,
                             in_stack_ffffffffffffeee4);
          local_58 = uVar2 + local_58;
          free_docio_object(this,(uint8_t)((ulong)puVar3 >> 0x38),(uint8_t)((ulong)puVar3 >> 0x30),
                            (uint8_t)((ulong)puVar3 >> 0x28));
        }
      }
      local_38 = local_58;
    }
  }
  return local_38;
}

Assistant:

LIBFDB_API
size_t fdb_estimate_space_used_from(fdb_file_handle *fhandle,
                                    fdb_snapshot_marker_t marker)
{
    uint64_t deltasize;
    size_t ret = 0;
    fdb_kvs_handle *handle;
    struct filemgr *file;
    bid_t hdr_bid = BLK_NOT_FOUND, prev_bid;
    size_t header_len;
    uint8_t header_buf[FDB_BLOCKSIZE];
    bid_t trie_root_bid = BLK_NOT_FOUND;
    bid_t seq_root_bid = BLK_NOT_FOUND;
    bid_t stale_root_bid = BLK_NOT_FOUND;
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t nlivenodes;
    uint64_t datasize;
    uint64_t last_wal_flush_hdr_bid;
    uint64_t kv_info_offset;
    uint64_t header_flags;
    uint64_t version;
    char *compacted_filename;
    fdb_seqnum_t seqnum;
    file_status_t fstatus;
    fdb_status status;

    if (!fhandle || !marker) {
        return 0;
    }
    handle = fhandle->root;
    if (!handle->file) {
        fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                FDB_RESULT_FILE_NOT_OPEN,
                "File not open.");
        return 0;
    }

    fdb_check_file_reopen(handle, &fstatus);
    fdb_sync_db_header(handle);

    // Start loading from current header
    file = handle->file;
    header_len = handle->file->header.size;

    // Reverse scan the file only summing up the delta.....
    while (marker <= hdr_bid) {
        if (hdr_bid == BLK_NOT_FOUND) {
            hdr_bid = handle->last_hdr_bid;
            status = filemgr_fetch_header(file, hdr_bid,
                                          header_buf, &header_len, NULL, NULL,
                                          &deltasize, &version, NULL,
                                          &handle->log_callback);
        } else {
            prev_bid = filemgr_fetch_prev_header(file, hdr_bid,
                                                 header_buf, &header_len,
                                                 &seqnum, NULL, &deltasize, &version,
                                                 NULL, &handle->log_callback);
            hdr_bid = prev_bid;
        }
        if (status != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, status,
                    "Failure to fetch DB header.");
            return 0;
        }
        if (header_len == 0) {
            status = FDB_RESULT_KV_STORE_NOT_FOUND; // can't work without header
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, status,
                    "Failure to find DB header.");
            return 0;
        }

        fdb_fetch_header(version, header_buf, &trie_root_bid, &seq_root_bid,
                         &stale_root_bid, &ndocs, &ndeletes, &nlivenodes, &datasize,
                         &last_wal_flush_hdr_bid, &kv_info_offset,
                         &header_flags, &compacted_filename, NULL);
        if (marker == hdr_bid) { // for the oldest header, sum up full values
            ret += datasize;
            ret += nlivenodes * handle->config.blocksize;
            break;
        } else { // for headers upto oldest header, sum up only deltas..
            ret += deltasize; // root kv store or single kv instance mode
            if (kv_info_offset != BLK_NOT_FOUND) { // Multi kv instance mode..
                int64_t doc_offset;
                struct docio_object doc;
                memset(&doc, 0, sizeof(struct docio_object));
                doc_offset = docio_read_doc(handle->dhandle, kv_info_offset,
                                            &doc, true);
                if (doc_offset <= 0) {
                    fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                            (fdb_status) doc_offset,
                            "Read failure estimate_space_used.");
                    return 0;
                }
                ret += _kvs_stat_get_sum_attr(doc.body, version,
                                              KVS_STAT_DELTASIZE);

                free_docio_object(&doc, 1, 1, 1);
            }
        }
    }

    return ret;
}